

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O3

void unodb::qsbr_per_thread::set_instance
               (unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>
                *new_instance)

{
  long lVar1;
  pointer __p;
  long *in_FS_OFFSET;
  
  current_thread_instance::__tls_init();
  lVar1 = *in_FS_OFFSET;
  __p = (new_instance->_M_t).
        super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>.
        _M_t.
        super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>
        .super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl;
  (new_instance->_M_t).
  super___uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl = (qsbr_per_thread *)0x0;
  std::__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::reset
            ((__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>
              *)(lVar1 + -0x10),__p);
  if ((char)in_FS_OFFSET[-4] == '\0') {
    set_instance();
  }
  return;
}

Assistant:

static void set_instance(
      std::unique_ptr<qsbr_per_thread> new_instance) noexcept {
    current_thread_instance = std::move(new_instance);
#ifndef UNODB_DETAIL_MSVC_CLANG
    // Force qsbr_per_thread destructor to run on thread exit. It already runs
    // without this kludge on most configurations, except with gcc --coverage on
    // macOS, and it seems it is not guaranteed -
    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=61991
    detail::on_thread_exit([]() noexcept { current_thread_instance.reset(); });
#endif
  }